

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O2

void Abc_FlowRetime_ConstrainExact_back_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes,int latch)

{
  uint uVar1;
  long lVar2;
  uint uStack_30;
  
  uVar1 = *(uint *)&pObj->field_0x14;
  if ((uVar1 & 0xf) == 8) {
    if (latch != 0) {
      return;
    }
    latch = 1;
  }
  else if (latch == 0) {
    if ((uVar1 & 0x10) != 0) {
      return;
    }
    latch = 0;
    uStack_30 = 0x10;
    goto LAB_003debe8;
  }
  if ((uVar1 & 0x20) != 0) {
    return;
  }
  uStack_30 = 0x20;
LAB_003debe8:
  *(uint *)&pObj->field_0x14 = uVar1 | uStack_30;
  for (lVar2 = 0; lVar2 < (pObj->vFanouts).nSize; lVar2 = lVar2 + 1) {
    Abc_FlowRetime_ConstrainExact_back_rec
              ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar2]],vNodes,latch);
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff;
  Vec_PtrPush(vNodes,(void *)((ulong)(latch != 0) ^ (ulong)pObj));
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainExact_back_rec( Abc_Obj_t * pObj, Vec_Ptr_t *vNodes, int latch ) {
  Abc_Obj_t *pNext;
  int i;

  // terminate?
  if (Abc_ObjIsLatch(pObj)) {
    if (latch) return;
    latch = 1;
  }

  // already visited?
  if (!latch) {
    if (pObj->fMarkA) return;
    pObj->fMarkA = 1;
  } else {
    if (pObj->fMarkB) return;
    pObj->fMarkB = 1;
  }

  // recurse
  Abc_ObjForEachFanout(pObj, pNext, i) {
    Abc_FlowRetime_ConstrainExact_back_rec( pNext, vNodes, latch );
  }

  // add
  pObj->Level = 0;
  Vec_PtrPush(vNodes, Abc_ObjNotCond(pObj, latch));
}